

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::InstanceSymbol::visitExprs<register_has_no_reset::MainVisitor&>
          (InstanceSymbol *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  reference ppPVar2;
  Expression *expr;
  PortConnection *conn;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *__range2;
  PortConnection *in_stack_00000178;
  InstanceSymbol *in_stack_ffffffffffffffb8;
  PortConnection *in_stack_ffffffffffffffc0;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> local_28;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *local_18;
  
  local_28 = getPortConnections(in_stack_ffffffffffffffb8);
  local_18 = &local_28;
  local_30._M_current =
       (PortConnection **)
       std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffffb8);
  std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffc0 = *ppPVar2;
    in_stack_ffffffffffffffb8 = (InstanceSymbol *)PortConnection::getExpression(in_stack_00000178);
    if (in_stack_ffffffffffffffb8 != (InstanceSymbol *)0x0) {
      Expression::visit<register_has_no_reset::MainVisitor&>
                ((Expression *)in_stack_ffffffffffffffc0,
                 (AlwaysFFVisitor *)in_stack_ffffffffffffffb8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void InstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto conn : getPortConnections()) {
        if (auto expr = conn->getExpression())
            expr->visit(visitor);
    }
}